

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

int pcut_run_test_forked(pcut_item_t *test)

{
  int iVar1;
  
  report_test_result = 0;
  print_test_error = 1;
  leave_means_exit = 1;
  iVar1 = run_test(test);
  current_test = (pcut_item_t *)0x0;
  current_suite = (pcut_item_t *)0x0;
  return iVar1;
}

Assistant:

int pcut_run_test_forked(pcut_item_t *test) {
	int rc;

	report_test_result = 0;
	print_test_error = 1;
	leave_means_exit = 1;

	rc = run_test(test);

	current_test = NULL;
	current_suite = NULL;

	return rc;
}